

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::tent_dist<double>::icdf(tent_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  double in_XMM0_Qa;
  result_type_conflict2 in_stack_00000008;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    local_8 = icdf_((tent_dist<double> *)x,in_stack_00000008);
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return icdf_(x);
    }